

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O2

char __thiscall Potassco::BufferedStream::get(BufferedStream *this)

{
  char cVar1;
  
  cVar1 = this->buf_[this->rpos_];
  if (cVar1 == '\0') {
    cVar1 = '\0';
  }
  else {
    rget(this);
    if (cVar1 != '\n') {
      if (cVar1 != '\r') {
        return cVar1;
      }
      if (this->buf_[this->rpos_] == '\n') {
        rget(this);
      }
    }
    this->line_ = this->line_ + 1;
    cVar1 = '\n';
  }
  return cVar1;
}

Assistant:

void AbstractProgram::theoryAtom(Id_t, Id_t, const IdSpan&) { throw std::logic_error("theory data not supported"); }